

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O2

Result<result_tests::NoCopy> *
result_tests::NoCopyFn(Result<result_tests::NoCopy> *__return_storage_ptr__,int i,bool success)

{
  string original;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  unique_ptr<int,_std::default_delete<int>_> in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff88;
  bilingual_str local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,success) == 0) {
    tinyformat::format<int>
              ((string *)&stack0xffffffffffffff88,"nocopy %i error.",(int *)&stack0xffffffffffffff84
              );
    original._M_string_length._0_4_ = in_stack_ffffffffffffff80;
    original._M_dataplus._M_p =
         (pointer)in_stack_ffffffffffffff78._M_t.
                  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
    original._M_string_length._4_4_ = i;
    original.field_2 = in_stack_ffffffffffffff88;
    Untranslated(&local_58,original);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,result_tests::NoCopy>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,result_tests::NoCopy> *)__return_storage_ptr__,
               &local_58);
    bilingual_str::~bilingual_str(&local_58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  else {
    NoCopy::NoCopy((NoCopy *)&stack0xffffffffffffff78,i);
    *(__uniq_ptr_data<int,_std::default_delete<int>,_true,_true> *)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_result_tests::NoCopy>.
      super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
      super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
      super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
      super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
      super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> =
         in_stack_ffffffffffffff78._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_result_tests::NoCopy>.
             super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x40) = '\x01';
    std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
              ((unique_ptr<int,_std::default_delete<int>_> *)&stack0xffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<NoCopy> NoCopyFn(int i, bool success)
{
    if (success) return {i};
    return util::Error{Untranslated(strprintf("nocopy %i error.", i))};
}